

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefineAutoInitProperty
              (JSContext *ctx,JSValue this_obj,JSAtom prop,JSAutoInitIDEnum id,void *opaque,
              int flags)

{
  JSShape *sh_00;
  uint uVar1;
  uint32_t *puVar2;
  JSShapeProperty *pJVar3;
  JSProperty *pJVar4;
  JSContext *pJVar5;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  JSContext *in_RDI;
  uint in_R8D;
  JSObject *in_R9;
  JSProperty *pr;
  JSObject *p;
  intptr_t h;
  JSShapeProperty *prop_1;
  JSShapeProperty *pr_1;
  JSShape *sh;
  uint uVar6;
  int local_44;
  ulong local_40;
  JSShapeProperty *local_8;
  
  if (in_EDX == -1) {
    sh_00 = *(JSShape **)(in_RSI + 0x18);
    uVar1 = sh_00->prop_hash_mask;
    uVar6 = in_ECX;
    puVar2 = prop_hash_end(sh_00);
    uVar1 = puVar2[-1 - (ulong)(in_ECX & uVar1)];
    pJVar3 = get_shape_prop(sh_00);
    while (local_40 = (ulong)uVar1, local_40 != 0) {
      local_8 = pJVar3 + (local_40 - 1);
      if (local_8->atom == in_ECX) goto LAB_0015661a;
      uVar1 = *(uint *)local_8 & 0x3ffffff;
    }
    local_8 = (JSShapeProperty *)0x0;
LAB_0015661a:
    if (local_8 != (JSShapeProperty *)0x0) {
      abort();
    }
    pJVar4 = add_property((JSContext *)CONCAT44(uVar6,in_R8D),in_R9,(JSAtom)((ulong)in_RSI >> 0x20),
                          (int)in_RSI);
    if (pJVar4 == (JSProperty *)0x0) {
      local_44 = -1;
    }
    else {
      pJVar5 = JS_DupContext(in_RDI);
      (pJVar4->u).getset.getter = (JSObject *)pJVar5;
      (pJVar4->u).init.realm_and_id = (ulong)in_R8D | (pJVar4->u).init.realm_and_id;
      (pJVar4->u).getset.setter = in_R9;
      local_44 = 1;
    }
  }
  else {
    local_44 = 0;
  }
  return local_44;
}

Assistant:

static int JS_DefineAutoInitProperty(JSContext *ctx, JSValueConst this_obj,
                                     JSAtom prop, JSAutoInitIDEnum id,
                                     void *opaque, int flags)
{
    JSObject *p;
    JSProperty *pr;

    if (JS_VALUE_GET_TAG(this_obj) != JS_TAG_OBJECT)
        return FALSE;

    p = JS_VALUE_GET_OBJ(this_obj);

    if (find_own_property(&pr, p, prop)) {
        /* property already exists */
        abort();
        return FALSE;
    }

    /* Specialized CreateProperty */
    pr = add_property(ctx, p, prop, (flags & JS_PROP_C_W_E) | JS_PROP_AUTOINIT);
    if (unlikely(!pr))
        return -1;
    pr->u.init.realm_and_id = (uintptr_t)JS_DupContext(ctx);
    assert((pr->u.init.realm_and_id & 3) == 0);
    assert(id <= 3);
    pr->u.init.realm_and_id |= id;
    pr->u.init.opaque = opaque;
    return TRUE;
}